

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O2

bool __thiscall
draco::CornerTable::Init
          (CornerTable *this,
          IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
          *faces)

{
  pointer pIVar1;
  bool bVar2;
  long lVar3;
  pointer paVar4;
  int iVar5;
  ulong uVar6;
  int i;
  long lVar7;
  int num_vertices;
  
  ValenceCache<draco::CornerTable>::ClearValenceCache(&this->valence_cache_);
  ValenceCache<draco::CornerTable>::ClearValenceCacheInaccurate(&this->valence_cache_);
  std::
  vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
  ::resize((vector<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
            *)this,(long)(faces->vector_).
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(faces->vector_).
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2);
  paVar4 = (faces->vector_).
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(faces->vector_).
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)paVar4;
  pIVar1 = (this->corner_to_vertex_map_).vector_.
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = 0;
  for (uVar6 = 0; uVar6 != (lVar3 / 0xc & 0xffffffffU); uVar6 = uVar6 + 1) {
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      pIVar1[(uint)(iVar5 + (int)lVar7)].value_ = paVar4->_M_elems[lVar7].value_;
    }
    iVar5 = iVar5 + 3;
    paVar4 = paVar4 + 1;
  }
  num_vertices = -1;
  bVar2 = ComputeOppositeCorners(this,&num_vertices);
  if (bVar2) {
    BreakNonManifoldEdges(this);
    ComputeVertexCorners(this,num_vertices);
  }
  return bVar2;
}

Assistant:

bool CornerTable::Init(const IndexTypeVector<FaceIndex, FaceType> &faces) {
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();
  corner_to_vertex_map_.resize(faces.size() * 3);
  for (FaceIndex fi(0); fi < static_cast<uint32_t>(faces.size()); ++fi) {
    for (int i = 0; i < 3; ++i) {
      corner_to_vertex_map_[FirstCorner(fi) + i] = faces[fi][i];
    }
  }
  int num_vertices = -1;
  if (!ComputeOppositeCorners(&num_vertices)) {
    return false;
  }
  if (!BreakNonManifoldEdges()) {
    return false;
  }
  if (!ComputeVertexCorners(num_vertices)) {
    return false;
  }
  return true;
}